

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_valid_no_geom_tri(REF_GRID ref_grid,REF_INT node,REF_BOOL *allowed)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  REF_INT cell;
  ulong uVar4;
  REF_BOOL valid;
  REF_INT nodes [27];
  int local_b4;
  REF_BOOL *local_b0;
  REF_INT local_a8 [30];
  
  local_b0 = allowed;
  if (ref_grid->twod != 0) {
    ref_node = ref_grid->node;
    *allowed = 0;
    ref_cell = ref_grid->cell[3];
    uVar4 = 0xffffffff;
    if (-1 < node) {
      uVar4 = 0xffffffff;
      if (node < ref_cell->ref_adj->nnode) {
        uVar4 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
      }
    }
    if ((int)uVar4 != -1) {
      cell = ref_cell->ref_adj->item[(int)uVar4].ref;
      do {
        uVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x108,"ref_smooth_valid_no_geom_tri",(ulong)uVar3,"nodes");
          return uVar3;
        }
        uVar3 = ref_node_tri_twod_orientation(ref_node,local_a8,&local_b4);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x109,"ref_smooth_valid_no_geom_tri",(ulong)uVar3,"valid");
          return uVar3;
        }
        if (local_b4 == 0) {
          return 0;
        }
        pRVar2 = ref_cell->ref_adj->item;
        iVar1 = pRVar2[(int)uVar4].next;
        uVar4 = (ulong)iVar1;
        if (uVar4 == 0xffffffffffffffff) {
          cell = -1;
        }
        else {
          cell = pRVar2[uVar4].ref;
        }
      } while (iVar1 != -1);
    }
  }
  *local_b0 = 1;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_valid_no_geom_tri(REF_GRID ref_grid,
                                                       REF_INT node,
                                                       REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL valid;

  if (!ref_grid_twod(ref_grid)) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}